

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  uint uVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  byte bVar4;
  char cVar5;
  short sVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ushort uVar10;
  short *psVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  size_t sVar19;
  bool bVar20;
  uint local_5c;
  
  uVar18 = 0xb;
  if (tableLog != 0) {
    uVar18 = tableLog;
  }
  bVar3 = (byte)uVar18;
  sVar19 = 0xffffffffffffffff;
  if (4 < uVar18) {
    if (uVar18 < 0xd) {
      uVar7 = FSE_minTableLog(total,maxSymbolValue);
      if (uVar7 <= uVar18) {
        cVar5 = -bVar3;
        bVar4 = cVar5 + 0x3e;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = total;
        uVar7 = 1 << (bVar3 & 0x1f);
        sVar19 = (size_t)uVar18;
        uVar18 = 0;
        local_5c = 0;
        uVar8 = 0;
        uVar12 = (ulong)uVar7;
        while( true ) {
          iVar15 = (int)uVar12;
          uVar16 = (uint)(total >> (bVar3 & 0x3f));
          if (maxSymbolValue < uVar18) break;
          uVar14 = (ulong)count[uVar18];
          if (uVar14 == total) {
            return 0;
          }
          if (uVar14 == 0) {
            normalizedCounter[uVar18] = 0;
          }
          else if (uVar16 < count[uVar18]) {
            uVar14 = uVar14 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar2,0);
            uVar12 = uVar14 >> (bVar4 & 0x3f);
            if ((uVar12 & 0xfff8) == 0) {
              uVar12 = (ulong)((int)uVar12 +
                              (uint)((ulong)FSE_normalizeCount::rtbTable[uVar12 & 0xffff] <<
                                     (cVar5 + 0x2aU & 0x3f) <
                                    uVar14 - ((uVar12 & 0xffff) << (bVar4 & 0x3f))));
            }
            uVar10 = (ushort)uVar12;
            if ((ushort)uVar8 < uVar10) {
              local_5c = uVar18;
            }
            if ((ushort)uVar8 < uVar10) {
              uVar8 = uVar12 & 0xffff;
            }
            normalizedCounter[uVar18] = uVar10;
            uVar12 = (ulong)(uint)(iVar15 - (int)(uVar12 & 0xffff));
          }
          else {
            normalizedCounter[uVar18] = -1;
            uVar12 = (ulong)(iVar15 - 1);
          }
          uVar18 = uVar18 + 1;
        }
        sVar6 = normalizedCounter[local_5c];
        iVar13 = (int)sVar6 >> 1;
        if (iVar13 == -iVar15 || SBORROW4(iVar13,-iVar15) != iVar13 + iVar15 < 0) {
          uVar12 = total * 3 >> (bVar3 + 1 & 0x3f);
          uVar14 = (ulong)(maxSymbolValue + 1);
          uVar18 = 0;
          for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
            uVar1 = count[uVar8];
            if ((ulong)uVar1 == 0) {
              normalizedCounter[uVar8] = 0;
            }
            else {
              if (uVar16 < uVar1) {
                if ((uint)uVar12 < uVar1) {
                  normalizedCounter[uVar8] = -2;
                  goto LAB_0010b25c;
                }
                normalizedCounter[uVar8] = 1;
              }
              else {
                normalizedCounter[uVar8] = -1;
              }
              uVar18 = uVar18 + 1;
              total = total - uVar1;
            }
LAB_0010b25c:
          }
          uVar16 = uVar7 - uVar18;
          if (uVar16 == 0) {
            return sVar19;
          }
          if ((uVar12 & 0xffffffff) < total / uVar16) {
            uVar8 = total * 3;
            for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
              if ((normalizedCounter[uVar12] == -2) &&
                 (uVar1 = count[uVar12], uVar1 <= (uint)(uVar8 / (uVar16 * 2)))) {
                normalizedCounter[uVar12] = 1;
                uVar18 = uVar18 + 1;
                total = total - uVar1;
              }
            }
            uVar16 = uVar7 - uVar18;
          }
          uVar12 = (ulong)uVar16;
          if (uVar18 != maxSymbolValue + 1) {
            if (total == 0) {
              uVar18 = 0;
              while ((int)uVar12 != 0) {
                if (0 < normalizedCounter[uVar18]) {
                  uVar12 = (ulong)((int)uVar12 - 1);
                  normalizedCounter[uVar18] = normalizedCounter[uVar18] + 1;
                }
                bVar20 = uVar18 == maxSymbolValue;
                uVar18 = uVar18 + 1;
                if (bVar20) {
                  uVar18 = 0;
                }
              }
              return sVar19;
            }
            uVar14 = ~(-1L << (cVar5 + 0x3dU & 0x3f));
            uVar18 = 0;
            uVar8 = uVar14;
            do {
              if (maxSymbolValue < uVar18) {
                return sVar19;
              }
              uVar9 = uVar8;
              if (normalizedCounter[uVar18] == -2) {
                uVar9 = (ulong)count[uVar18] * (((uVar12 << (bVar4 & 0x3f)) + uVar14) / total) +
                        uVar8;
                uVar8 = uVar8 >> (bVar4 & 0x3f);
                uVar17 = uVar9 >> (bVar4 & 0x3f);
                if (uVar17 == uVar8) {
                  return 0xffffffffffffffff;
                }
                normalizedCounter[uVar18] = (short)uVar17 - (short)uVar8;
              }
              uVar18 = uVar18 + 1;
              uVar8 = uVar9;
            } while( true );
          }
          uVar8 = 0;
          uVar18 = 0;
          for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
            if (uVar18 < count[uVar9]) {
              uVar8 = uVar9 & 0xffffffff;
              uVar18 = count[uVar9];
            }
          }
          psVar11 = normalizedCounter + uVar8;
          sVar6 = *psVar11;
        }
        else {
          psVar11 = normalizedCounter + local_5c;
        }
        *psVar11 = sVar6 + (short)uVar12;
      }
    }
    else {
      sVar19 = 0xffffffffffffffd4;
    }
  }
  return sVar19;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}